

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase109::run(TestCase109 *this)

{
  Builder builder_00;
  Reader reader;
  Builder builder_01;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  char *pcVar10;
  Reader RVar11;
  Builder BVar12;
  DebugComparison<int,_unsigned_int> _kjCondition_5;
  uint local_388;
  ushort uStack_384;
  DebugComparison<int,_unsigned_int> _kjCondition_3;
  uint local_358;
  DebugComparison<int,_unsigned_long> _kjCondition_16;
  Builder root;
  undefined4 uStack_2e0;
  uint local_2dc;
  DebugComparison<int,_int> _kjCondition;
  uint local_2b8;
  ushort local_2b4;
  int local_2b0;
  bool local_2a8;
  ulong local_1d8;
  PointerBuilder local_1d0;
  size_t local_1b8;
  undefined1 local_1b0 [24];
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  StructBuilder local_178;
  StructReader local_150;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&_kjCondition_3,&builder.super_MessageBuilder);
  _kjCondition.op.content.size_ = _kjCondition_3.op.content.size_;
  _kjCondition.left = _kjCondition_3.left;
  _kjCondition.right = _kjCondition_3.right;
  _kjCondition.op.content.ptr = _kjCondition_3.op.content.ptr;
  PointerBuilder::getStruct
            (&root._builder,(PointerBuilder *)&_kjCondition,(StructSize)0x10000,(word *)0x0);
  _kjCondition.left = (int)root._builder.segment;
  _kjCondition.right = (int)((ulong)root._builder.segment >> 0x20);
  _kjCondition.op.content.ptr = (char *)root._builder.capTable;
  _kjCondition.op.content.size_ = (size_t)root._builder.pointers;
  PointerBuilder::initStruct(&local_178,(PointerBuilder *)&_kjCondition,(StructSize)0x140006);
  builder_01._builder.segment._4_4_ = local_2dc;
  builder_01._builder.segment._0_4_ = uStack_2e0;
  builder_01._builder.capTable._0_4_ = _kjCondition.left;
  builder_01._builder.capTable._4_4_ = _kjCondition.right;
  builder_01._builder.data = _kjCondition.op.content.ptr;
  builder_01._builder.pointers = (WirePointer *)_kjCondition.op.content.size_;
  builder_01._builder.dataSize._0_1_ = _kjCondition.result;
  builder_01._builder._33_7_ = _kjCondition._25_7_;
  initTestMessage(builder_01);
  _kjCondition.left = (int)root._builder.segment;
  _kjCondition.right = (int)((ulong)root._builder.segment >> 0x20);
  _kjCondition.op.content.ptr = (char *)root._builder.capTable;
  _kjCondition.op.content.size_ = (size_t)root._builder.pointers;
  PointerBuilder::getStruct
            ((StructBuilder *)(local_1b0 + 0x10),(PointerBuilder *)&_kjCondition,
             (StructSize)0x140006,(word *)0x0);
  builder_00._builder.capTable = (CapTableBuilder *)uStack_198;
  builder_00._builder.segment = (SegmentBuilder *)local_1b0._16_8_;
  builder_00._builder.data = (void *)local_190;
  builder_00._builder.pointers = (WirePointer *)uStack_188;
  builder_00._builder.dataSize = (undefined4)local_180;
  builder_00._builder.pointerCount = local_180._4_2_;
  builder_00._builder._38_2_ = local_180._6_2_;
  checkTestMessage(builder_00);
  StructBuilder::asReader(&root._builder);
  if (local_2b4 == 0) {
    _kjCondition_3._24_4_ = 0x7fffffff;
    _kjCondition_3.op.content.ptr = (char *)0x0;
    _kjCondition_3.op.content.size_ = 0;
    _kjCondition_3.left = 0;
    _kjCondition_3.right = 0;
  }
  else {
    _kjCondition_3.right = _kjCondition.right;
    _kjCondition_3.left = _kjCondition.left;
    _kjCondition_3.op.content.size_ = CONCAT71(_kjCondition._25_7_,_kjCondition.result);
    _kjCondition_3.op.content.ptr = _kjCondition.op.content.ptr;
    _kjCondition_3._24_4_ = local_2b0;
  }
  PointerReader::getStruct(&local_150,(PointerReader *)&_kjCondition_3,(word *)0x0);
  reader._reader.capTable = local_150.capTable;
  reader._reader.segment = local_150.segment;
  reader._reader.data = local_150.data;
  reader._reader.pointers = local_150.pointers;
  reader._reader.dataSize = local_150.dataSize;
  reader._reader.pointerCount = local_150.pointerCount;
  reader._reader._38_2_ = local_150._38_2_;
  reader._reader.nestingLimit = local_150.nestingLimit;
  reader._reader._44_4_ = local_150._44_4_;
  checkTestMessage(reader);
  _kjCondition_3._0_8_ = root._builder.segment;
  _kjCondition_3.op.content.ptr = (char *)root._builder.capTable;
  _kjCondition_3.op.content.size_ = (size_t)root._builder.pointers;
  PointerBuilder::getStruct
            ((StructBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_3,(StructSize)0x0,
             (word *)0x0);
  sVar9 = _kjCondition.op.content.size_;
  _kjCondition_5.op.content.ptr = (char *)root._builder.capTable;
  _kjCondition_5._0_8_ = root._builder.segment;
  _kjCondition_5.op.content.size_ = (size_t)root._builder.pointers;
  PointerBuilder::getStruct
            ((StructBuilder *)&_kjCondition_3,(PointerBuilder *)&_kjCondition_5,(StructSize)0x0,
             (word *)0x0);
  StructBuilder::asReader((StructBuilder *)&_kjCondition_3);
  sVar6 = _kjCondition.op.content.size_;
  *(undefined4 *)(sVar9 + 4) = 100;
  _kjCondition.right = *(int *)(sVar9 + 4);
  _kjCondition.left = 100;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 100;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_3.left = 100;
    _kjCondition_5.left = *(int *)(sVar9 + 4);
    kj::_::Debug::log<char_const(&)[53],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x78,ERROR,
               "\"failed: expected \" \"(100) == (allTypes.getInt32Field())\", _kjCondition, 100, allTypes.getInt32Field()"
               ,(char (*) [53])"failed: expected (100) == (allTypes.getInt32Field())",&_kjCondition,
               (int *)&_kjCondition_3,&_kjCondition_5.left);
  }
  _kjCondition.right = 0;
  if (0x3f < local_2b8) {
    _kjCondition.right = *(int *)(sVar6 + 4);
  }
  _kjCondition.left = 100;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 100;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    iVar7 = 0;
    _kjCondition_3.left = 100;
    if (0x3f < local_2b8) {
      iVar7 = *(int *)(sVar6 + 4);
    }
    _kjCondition_5.left = iVar7;
    kj::_::Debug::log<char_const(&)[59],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x79,ERROR,
               "\"failed: expected \" \"(100) == (allTypesReader.getInt32Field())\", _kjCondition, 100, allTypesReader.getInt32Field()"
               ,(char (*) [59])"failed: expected (100) == (allTypesReader.getInt32Field())",
               &_kjCondition,(int *)&_kjCondition_3,&_kjCondition_5.left);
  }
  _kjCondition_5.op.content.size_ = (size_t)root._builder.pointers;
  PointerBuilder::getStruct
            ((StructBuilder *)&_kjCondition_3,(PointerBuilder *)&_kjCondition_5,(StructSize)0x0,
             (word *)0x0);
  uVar8 = local_358 >> 3;
  _kjCondition.op.content.ptr = (char *)(ulong)uVar8;
  _kjCondition.left = 0x30;
  _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_a9f8;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  local_2b8 = CONCAT31(local_2b8._1_3_,uVar8 == 0x30);
  if ((uVar8 != 0x30) && (kj::_::Debug::minSeverity < 3)) {
    local_1d0.segment = (SegmentBuilder *)CONCAT44(local_1d0.segment._4_4_,0x30);
    _kjCondition_5.op.content.size_ = (size_t)root._builder.pointers;
    PointerBuilder::getStruct
              ((StructBuilder *)&_kjCondition_3,(PointerBuilder *)&_kjCondition_5,(StructSize)0x0,
               (word *)0x0);
    _kjCondition_16._4_4_ = 0;
    _kjCondition_16.left = local_358 >> 3;
    kj::_::Debug::
    log<char_const(&)[96],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x7b,ERROR,
               "\"failed: expected \" \"(48) == (root.getAnyPointerField().getAs<AnyStruct>().getDataSection().size())\", _kjCondition, 48, root.getAnyPointerField().getAs<AnyStruct>().getDataSection().size()"
               ,(char (*) [96])
                "failed: expected (48) == (root.getAnyPointerField().getAs<AnyStruct>().getDataSection().size())"
               ,(DebugComparison<int,_unsigned_long> *)&_kjCondition,(int *)&local_1d0,
               (unsigned_long *)&_kjCondition_16);
  }
  _kjCondition_5.op.content.size_ = (size_t)root._builder.pointers;
  PointerBuilder::getStruct
            ((StructBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_5,(StructSize)0x0,
             (word *)0x0);
  _kjCondition_3.right._0_2_ = local_2b4;
  _kjCondition_3.left = 0x14;
  _kjCondition_3.right._2_2_ = 0;
  _kjCondition_3.op.content.ptr = " == ";
  _kjCondition_3.op.content.size_ = 5;
  _kjCondition_3.result = local_2b4 == 0x14;
  if ((local_2b4 != 0x14) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_16.left = 0x14;
    _kjCondition_5.op.content.size_ = (size_t)root._builder.pointers;
    PointerBuilder::getStruct
              ((StructBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_5,(StructSize)0x0,
               (word *)0x0);
    local_1d0.segment = (SegmentBuilder *)CONCAT44(local_1d0.segment._4_4_,(uint)local_2b4);
    kj::_::Debug::log<char_const(&)[99],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x7c,ERROR,
               "\"failed: expected \" \"(20) == (root.getAnyPointerField().getAs<AnyStruct>().getPointerSection().size())\", _kjCondition, 20, root.getAnyPointerField().getAs<AnyStruct>().getPointerSection().size()"
               ,(char (*) [99])
                "failed: expected (20) == (root.getAnyPointerField().getAs<AnyStruct>().getPointerSection().size())"
               ,&_kjCondition_3,&_kjCondition_16.left,(uint *)&local_1d0);
  }
  local_1d0.segment = root._builder.segment;
  local_1d0.capTable = root._builder.capTable;
  local_1d0.pointer = root._builder.pointers;
  PointerBuilder::asReader(&local_1d0);
  _kjCondition_5.op.content.size_ = (size_t)_kjCondition_16.op.content.ptr;
  _kjCondition_5._24_8_ = _kjCondition_16.op.content.size_;
  _kjCondition_5.left = _kjCondition_16.left;
  _kjCondition_5.right = _kjCondition_16._4_4_;
  _kjCondition_5.op.content.ptr = (char *)_kjCondition_16.right;
  PointerReader::getStruct
            ((StructReader *)&_kjCondition,(PointerReader *)&_kjCondition_5,(word *)0x0);
  _kjCondition_3.op.content.ptr = (char *)(ulong)(local_2b8 >> 3);
  _kjCondition_3.left = 0x30;
  _kjCondition_3.op.content.size_ = (size_t)anon_var_dwarf_a9f8;
  _kjCondition_3.result = true;
  _kjCondition_3._25_7_ = 0;
  if ((local_2b8 >> 3 != 0x30) && (kj::_::Debug::minSeverity < 3)) {
    local_2dc = 0x30;
    local_1d0.segment = root._builder.segment;
    local_1d0.capTable = root._builder.capTable;
    local_1d0.pointer = root._builder.pointers;
    PointerBuilder::asReader(&local_1d0);
    _kjCondition_5.op.content.size_ = (size_t)_kjCondition_16.op.content.ptr;
    _kjCondition_5._24_8_ = _kjCondition_16.op.content.size_;
    _kjCondition_5.left = _kjCondition_16.left;
    _kjCondition_5.right = _kjCondition_16._4_4_;
    _kjCondition_5.op.content.ptr = (char *)_kjCondition_16.right;
    PointerReader::getStruct
              ((StructReader *)&_kjCondition,(PointerReader *)&_kjCondition_5,(word *)0x0);
    local_1d8 = (ulong)(local_2b8 >> 3);
    kj::_::Debug::
    log<char_const(&)[107],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x7e,ERROR,
               "\"failed: expected \" \"(48) == (root.getAnyPointerField().asReader().getAs<AnyStruct>().getDataSection().size())\", _kjCondition, 48, root.getAnyPointerField().asReader().getAs<AnyStruct>().getDataSection().size()"
               ,(char (*) [107])
                "failed: expected (48) == (root.getAnyPointerField().asReader().getAs<AnyStruct>().getDataSection().size())"
               ,(DebugComparison<int,_unsigned_long> *)&_kjCondition_3,(int *)&local_2dc,&local_1d8)
    ;
  }
  local_1d0.segment = root._builder.segment;
  local_1d0.capTable = root._builder.capTable;
  local_1d0.pointer = root._builder.pointers;
  PointerBuilder::asReader(&local_1d0);
  auVar3 = (undefined1  [16])_kjCondition_16._0_16_;
  _kjCondition_3.op.content.size_ = (size_t)_kjCondition_16.op.content.ptr;
  _kjCondition_3._24_8_ = _kjCondition_16.op.content.size_;
  _kjCondition_3.left = _kjCondition_16.left;
  _kjCondition_3.right = _kjCondition_16._4_4_;
  _kjCondition_3.op.content.ptr = (char *)_kjCondition_16.right;
  _kjCondition_16._0_16_ = auVar3;
  PointerReader::getStruct
            ((StructReader *)&_kjCondition,(PointerReader *)&_kjCondition_3,(word *)0x0);
  _kjCondition_5.right._0_2_ = local_2b4;
  _kjCondition_5.left = 0x14;
  _kjCondition_5.right._2_2_ = 0;
  _kjCondition_5.op.content.ptr = " == ";
  _kjCondition_5.op.content.size_ = 5;
  _kjCondition_5.result = local_2b4 == 0x14;
  if ((local_2b4 != 0x14) && (kj::_::Debug::minSeverity < 3)) {
    local_1d8 = CONCAT44(local_1d8._4_4_,0x14);
    local_1d0.segment = root._builder.segment;
    local_1d0.capTable = root._builder.capTable;
    local_1d0.pointer = root._builder.pointers;
    PointerBuilder::asReader(&local_1d0);
    auVar3 = (undefined1  [16])_kjCondition_16._0_16_;
    _kjCondition_3.op.content.size_ = (size_t)_kjCondition_16.op.content.ptr;
    _kjCondition_3._24_8_ = _kjCondition_16.op.content.size_;
    _kjCondition_3.left = _kjCondition_16.left;
    _kjCondition_3.right = _kjCondition_16._4_4_;
    _kjCondition_3.op.content.ptr = (char *)_kjCondition_16.right;
    _kjCondition_16._0_16_ = auVar3;
    PointerReader::getStruct
              ((StructReader *)&_kjCondition,(PointerReader *)&_kjCondition_3,(word *)0x0);
    local_2dc = (uint)local_2b4;
    kj::_::Debug::log<char_const(&)[110],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x7f,ERROR,
               "\"failed: expected \" \"(20) == (root.getAnyPointerField().asReader().getAs<AnyStruct>().getPointerSection().size())\", _kjCondition, 20, root.getAnyPointerField().asReader().getAs<AnyStruct>().getPointerSection().size()"
               ,(char (*) [110])
                "failed: expected (20) == (root.getAnyPointerField().asReader().getAs<AnyStruct>().getPointerSection().size())"
               ,&_kjCondition_5,(int *)&local_1d8,&local_2dc);
  }
  _kjCondition_3._0_8_ = root._builder.segment;
  _kjCondition_3.op.content.ptr = (char *)root._builder.capTable;
  _kjCondition_3.op.content.size_ = (size_t)root._builder.pointers;
  PointerBuilder::getStruct
            ((StructBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_3,(StructSize)0x140006,
             (word *)0x0);
  uVar8 = local_2b8 >> 3;
  _kjCondition.op.content.ptr = (char *)(ulong)uVar8;
  _kjCondition.left = 0x30;
  _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_a9f8;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  local_2b8 = CONCAT31(local_2b8._1_3_,uVar8 == 0x30);
  if ((uVar8 != 0x30) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_5.left = 0x30;
    _kjCondition_3._0_8_ = _kjCondition.op.content.ptr;
    kj::_::Debug::
    log<char_const(&)[53],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x82,ERROR,
               "\"failed: expected \" \"(48) == (b.getDataSection().size())\", _kjCondition, 48, b.getDataSection().size()"
               ,(char (*) [53])"failed: expected (48) == (b.getDataSection().size())",
               (DebugComparison<int,_unsigned_long> *)&_kjCondition,&_kjCondition_5.left,
               (unsigned_long *)&_kjCondition_3);
  }
  _kjCondition.left = 0x14;
  _kjCondition.right = (int)local_2b4;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 0x14;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_3.left = 0x14;
    _kjCondition_5.left = (uint)local_2b4;
    kj::_::Debug::log<char_const(&)[56],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x83,ERROR,
               "\"failed: expected \" \"(20) == (b.getPointerSection().size())\", _kjCondition, 20, b.getPointerSection().size()"
               ,(char (*) [56])"failed: expected (20) == (b.getPointerSection().size())",
               (DebugComparison<int,_unsigned_int> *)&_kjCondition,&_kjCondition_3.left,
               (uint *)&_kjCondition_5);
  }
  _kjCondition_3._0_8_ = root._builder.segment;
  _kjCondition_3.op.content.ptr = (char *)root._builder.capTable;
  _kjCondition_3.op.content.size_ = (size_t)root._builder.pointers;
  PointerBuilder::getStruct
            ((StructBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_3,(StructSize)0x140006,
             (word *)0x0);
  pcVar5 = _kjCondition.op.content.ptr;
  local_1b0._4_4_ = _kjCondition.right;
  local_1b0._0_4_ = _kjCondition.left;
  local_1b8 = CONCAT71(_kjCondition._25_7_,_kjCondition.result);
  uVar8 = local_2b8 >> 3;
  _kjCondition.op.content.ptr = (char *)(ulong)uVar8;
  _kjCondition.left = 0x30;
  _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_a9f8;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  local_2b8 = CONCAT31(local_2b8._1_3_,uVar8 == 0x30);
  if ((uVar8 != 0x30) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_5.left = 0x30;
    _kjCondition_3._0_8_ = _kjCondition.op.content.ptr;
    kj::_::Debug::
    log<char_const(&)[53],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x87,ERROR,
               "\"failed: expected \" \"(48) == (b.getDataSection().size())\", _kjCondition, 48, b.getDataSection().size()"
               ,(char (*) [53])"failed: expected (48) == (b.getDataSection().size())",
               (DebugComparison<int,_unsigned_long> *)&_kjCondition,&_kjCondition_5.left,
               (unsigned_long *)&_kjCondition_3);
  }
  _kjCondition.left = 0x14;
  _kjCondition.right = (int)local_2b4;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 0x14;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_3.left = 0x14;
    _kjCondition_5.left = (uint)local_2b4;
    kj::_::Debug::log<char_const(&)[56],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x88,ERROR,
               "\"failed: expected \" \"(20) == (b.getPointerSection().size())\", _kjCondition, 20, b.getPointerSection().size()"
               ,(char (*) [56])"failed: expected (20) == (b.getPointerSection().size())",
               (DebugComparison<int,_unsigned_int> *)&_kjCondition,&_kjCondition_3.left,
               (uint *)&_kjCondition_5);
  }
  _kjCondition_5.op.content.ptr = (char *)root._builder.capTable;
  _kjCondition_5._0_8_ = root._builder.segment;
  _kjCondition_5.op.content.size_ = (size_t)root._builder.pointers;
  PointerBuilder::getStruct
            ((StructBuilder *)&_kjCondition_3,(PointerBuilder *)&_kjCondition_5,(StructSize)0x140006
             ,(word *)0x0);
  StructBuilder::asReader((StructBuilder *)&_kjCondition_3);
  uVar8 = local_2b8 >> 3;
  _kjCondition.op.content.ptr = (char *)(ulong)uVar8;
  _kjCondition.left = 0x30;
  _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_a9f8;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  local_2b8 = CONCAT31(local_2b8._1_3_,uVar8 == 0x30);
  if ((uVar8 != 0x30) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_5.left = 0x30;
    _kjCondition_3._0_8_ = _kjCondition.op.content.ptr;
    kj::_::Debug::
    log<char_const(&)[53],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x8c,ERROR,
               "\"failed: expected \" \"(48) == (r.getDataSection().size())\", _kjCondition, 48, r.getDataSection().size()"
               ,(char (*) [53])"failed: expected (48) == (r.getDataSection().size())",
               (DebugComparison<int,_unsigned_long> *)&_kjCondition,&_kjCondition_5.left,
               (unsigned_long *)&_kjCondition_3);
  }
  _kjCondition.left = 0x14;
  _kjCondition.right = (int)local_2b4;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 0x14;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_3.left = 0x14;
    _kjCondition_5.left = (uint)local_2b4;
    kj::_::Debug::log<char_const(&)[56],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x8d,ERROR,
               "\"failed: expected \" \"(20) == (r.getPointerSection().size())\", _kjCondition, 20, r.getPointerSection().size()"
               ,(char (*) [56])"failed: expected (20) == (r.getPointerSection().size())",
               (DebugComparison<int,_unsigned_int> *)&_kjCondition,(int *)&_kjCondition_3,
               (uint *)&_kjCondition_5);
  }
  _kjCondition_16.op.content.ptr = (char *)root._builder.pointers;
  PointerBuilder::getStruct
            ((StructBuilder *)&_kjCondition_5,(PointerBuilder *)&_kjCondition_16,
             (StructSize)0x140006,(word *)0x0);
  auVar3 = (undefined1  [16])_kjCondition_5._0_16_;
  _kjCondition_3.left = _kjCondition_5.left;
  _kjCondition_3.right = _kjCondition_5.right;
  _kjCondition_3.op.content.ptr = _kjCondition_5.op.content.ptr;
  _kjCondition_3.op.content.size_ = _kjCondition_5.op.content.size_;
  _kjCondition_3.result = _kjCondition_5.result;
  _kjCondition_3._25_7_ = _kjCondition_5._25_7_;
  _kjCondition_5._0_16_ = auVar3;
  StructBuilder::asReader((StructBuilder *)&_kjCondition_3);
  uVar8 = local_2b8 >> 3;
  _kjCondition.op.content.ptr = (char *)(ulong)uVar8;
  _kjCondition.left = 0x30;
  _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_a9f8;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  local_2b8 = CONCAT31(local_2b8._1_3_,uVar8 == 0x30);
  if ((uVar8 != 0x30) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_5.left = 0x30;
    _kjCondition_3._0_8_ = _kjCondition.op.content.ptr;
    kj::_::Debug::
    log<char_const(&)[53],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x90,ERROR,
               "\"failed: expected \" \"(48) == (r.getDataSection().size())\", _kjCondition, 48, r.getDataSection().size()"
               ,(char (*) [53])"failed: expected (48) == (r.getDataSection().size())",
               (DebugComparison<int,_unsigned_long> *)&_kjCondition,&_kjCondition_5.left,
               (unsigned_long *)&_kjCondition_3);
  }
  _kjCondition.left = 0x14;
  _kjCondition.right = (int)local_2b4;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 0x14;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_3.left = 0x14;
    _kjCondition_5.left = (uint)local_2b4;
    kj::_::Debug::log<char_const(&)[56],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x91,ERROR,
               "\"failed: expected \" \"(20) == (r.getPointerSection().size())\", _kjCondition, 20, r.getPointerSection().size()"
               ,(char (*) [56])"failed: expected (20) == (r.getPointerSection().size())",
               (DebugComparison<int,_unsigned_int> *)&_kjCondition,(int *)&_kjCondition_3,
               (uint *)&_kjCondition_5);
  }
  _kjCondition_5.op.content.ptr = (char *)root._builder.capTable;
  _kjCondition_5._0_8_ = root._builder.segment;
  _kjCondition_5.op.content.size_ = (size_t)root._builder.pointers;
  PointerBuilder::getStruct
            ((StructBuilder *)&_kjCondition_3,(PointerBuilder *)&_kjCondition_5,(StructSize)0x140006
             ,(word *)0x0);
  StructBuilder::asReader((StructBuilder *)&_kjCondition_3);
  pcVar4 = _kjCondition.op.content.ptr;
  uVar1._4_4_ = _kjCondition.right;
  uVar1._0_4_ = _kjCondition.left;
  local_1b0._8_8_ = _kjCondition.op.content.size_;
  sVar9 = CONCAT71(_kjCondition._25_7_,_kjCondition.result);
  pcVar10 = (char *)(ulong)(local_2b8 >> 3);
  _kjCondition.left = 0x30;
  _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_a9f8;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  if ((local_2b8 >> 3 != 0x30) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_5.left = 0x30;
    _kjCondition_3._0_8_ = pcVar10;
    _kjCondition.op.content.ptr = pcVar10;
    kj::_::Debug::
    log<char_const(&)[53],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x95,ERROR,
               "\"failed: expected \" \"(48) == (r.getDataSection().size())\", _kjCondition, 48, r.getDataSection().size()"
               ,(char (*) [53])"failed: expected (48) == (r.getDataSection().size())",
               (DebugComparison<int,_unsigned_long> *)&_kjCondition,&_kjCondition_5.left,
               (unsigned_long *)&_kjCondition_3);
  }
  _kjCondition.left = 0x14;
  _kjCondition.right = (int)local_2b4;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 0x14;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_3.left = 0x14;
    _kjCondition_5.left = (uint)local_2b4;
    kj::_::Debug::log<char_const(&)[56],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x96,ERROR,
               "\"failed: expected \" \"(20) == (r.getPointerSection().size())\", _kjCondition, 20, r.getPointerSection().size()"
               ,(char (*) [56])"failed: expected (20) == (r.getPointerSection().size())",
               (DebugComparison<int,_unsigned_int> *)&_kjCondition,(int *)&_kjCondition_3,
               (uint *)&_kjCondition_5);
  }
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&_kjCondition,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&_kjCondition_16,(MessageBuilder *)&_kjCondition);
  _kjCondition_5.op.content.size_ = (size_t)_kjCondition_16.op.content.ptr;
  PointerBuilder::getStruct
            ((StructBuilder *)&_kjCondition_3,(PointerBuilder *)&_kjCondition_5,(StructSize)0x10000,
             (word *)0x0);
  _kjCondition_16.right = (unsigned_long)_kjCondition_3.op.content.ptr;
  _kjCondition_16.left = _kjCondition_3.left;
  _kjCondition_16._4_4_ = _kjCondition_3.right;
  _kjCondition_16.op.content.ptr = (char *)_kjCondition_3._24_8_;
  PointerBuilder::initStruct
            ((StructBuilder *)&_kjCondition_5,(PointerBuilder *)&_kjCondition_16,
             (StructSize)(((local_2b8._1_3_ & 0x3fff) << 8) >> 6 | (uint)local_2b4 << 0x10));
  uVar8 = local_388 >> 3;
  _kjCondition_16.left = 0x30;
  _kjCondition_16.right._0_4_ = uVar8;
  _kjCondition_16.right._4_4_ = 0;
  _kjCondition_16.op.content.ptr = " == ";
  _kjCondition_16.op.content.size_ = 5;
  _kjCondition_16.result = uVar8 == 0x30;
  if ((!_kjCondition_16.result) && (kj::_::Debug::minSeverity < 3)) {
    local_1d8 = CONCAT44(local_1d8._4_4_,0x30);
    local_1d0.segment = (SegmentBuilder *)(ulong)uVar8;
    kj::_::Debug::
    log<char_const(&)[54],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x9f,ERROR,
               "\"failed: expected \" \"(48) == (sb.getDataSection().size())\", _kjCondition, 48, sb.getDataSection().size()"
               ,(char (*) [54])"failed: expected (48) == (sb.getDataSection().size())",
               &_kjCondition_16,(int *)&local_1d8,(unsigned_long *)&local_1d0);
  }
  _kjCondition_16._4_2_ = uStack_384;
  _kjCondition_16.left = 0x14;
  _kjCondition_16._6_2_ = 0;
  _kjCondition_16.right = (unsigned_long)anon_var_dwarf_a9f8;
  _kjCondition_16.op.content.ptr = &DAT_00000005;
  _kjCondition_16.op.content.size_ =
       CONCAT71(_kjCondition_16.op.content.size_._1_7_,uStack_384 == 0x14);
  if ((uStack_384 != 0x14) && (kj::_::Debug::minSeverity < 3)) {
    local_1d0.segment = (SegmentBuilder *)CONCAT44(local_1d0.segment._4_4_,0x14);
    local_1d8 = CONCAT44(local_1d8._4_4_,(uint)uStack_384);
    kj::_::Debug::log<char_const(&)[57],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xa0,ERROR,
               "\"failed: expected \" \"(20) == (sb.getPointerSection().size())\", _kjCondition, 20, sb.getPointerSection().size()"
               ,(char (*) [57])"failed: expected (20) == (sb.getPointerSection().size())",
               (DebugComparison<int,_unsigned_int> *)&_kjCondition_16,(int *)&local_1d0,
               (uint *)&local_1d8);
  }
  memcpy((void *)_kjCondition_5.op.content.size_,(void *)local_1b0._8_8_,(size_t)pcVar10);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&_kjCondition);
  _kjCondition_16._0_8_ = anon_var_dwarf_a812;
  _kjCondition_3.op.content.ptr = pcVar4;
  _kjCondition_3._0_8_ = uVar1;
  _kjCondition_3.op.content.size_ = sVar9;
  _kjCondition_5._0_16_ =
       PointerReader::getBlob<capnp::Text>((PointerReader *)&_kjCondition_3,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)&_kjCondition,
             (DebugExpression<char_const(&)[4]> *)&_kjCondition_16,(Reader *)&_kjCondition_5);
  if ((local_2b0._0_1_ == false) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_3.op.content.ptr = pcVar4;
    _kjCondition_3._0_8_ = uVar1;
    _kjCondition_3.op.content.size_ = sVar9;
    _kjCondition_5._0_16_ =
         PointerReader::getBlob<capnp::Text>((PointerReader *)&_kjCondition_3,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[52],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xa8,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (ptrs[0].getAs<Text>())\", _kjCondition, \"foo\", ptrs[0].getAs<Text>()"
               ,(char (*) [52])"failed: expected (\"foo\") == (ptrs[0].getAs<Text>())",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)&_kjCondition,
               (char (*) [4])"foo",(Reader *)&_kjCondition_5);
  }
  _kjCondition_16._0_8_ = "bar";
  _kjCondition_3.op.content.ptr = pcVar4;
  _kjCondition_3._24_4_ = local_2b0;
  _kjCondition_3._0_8_ = uVar1;
  _kjCondition_3.op.content.size_ = sVar9 + 8;
  RVar11 = PointerReader::getBlob<capnp::Data>((PointerReader *)&_kjCondition_3,(void *)0x0,0);
  kj::heapString((String *)&_kjCondition_5,(char *)RVar11.super_ArrayPtr<const_unsigned_char>.ptr,
                 RVar11.super_ArrayPtr<const_unsigned_char>.size_);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_kj::String> *)&_kjCondition,
             (DebugExpression<char_const(&)[4]> *)&_kjCondition_16,(String *)&_kjCondition_5);
  uVar2 = _kjCondition_5._0_8_;
  if (_kjCondition_5._0_8_ != 0) {
    pcVar10 = _kjCondition_5.op.content.ptr;
    _kjCondition_5._0_16_ = ZEXT816(0);
    (*(code *)**(undefined8 **)_kjCondition_5.op.content.size_)
              (_kjCondition_5.op.content.size_,uVar2,1,pcVar10,pcVar10,0);
  }
  if ((local_2a8 == false) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_3.op.content.ptr = pcVar4;
    _kjCondition_3._0_8_ = uVar1;
    _kjCondition_3.op.content.size_ = sVar9 + 8;
    RVar11 = PointerReader::getBlob<capnp::Data>((PointerReader *)&_kjCondition_3,(void *)0x0,0);
    kj::heapString((String *)&_kjCondition_5,(char *)RVar11.super_ArrayPtr<const_unsigned_char>.ptr,
                   RVar11.super_ArrayPtr<const_unsigned_char>.size_);
    kj::_::Debug::
    log<char_const(&)[78],kj::_::DebugComparison<char_const(&)[4],kj::String>&,char_const(&)[4],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xa9,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (kj::heapString(ptrs[1].getAs<Data>().asChars()))\", _kjCondition, \"bar\", kj::heapString(ptrs[1].getAs<Data>().asChars())"
               ,(char (*) [78])
                "failed: expected (\"bar\") == (kj::heapString(ptrs[1].getAs<Data>().asChars()))",
               (DebugComparison<const_char_(&)[4],_kj::String> *)&_kjCondition,
               (char (*) [4])0x299857,(String *)&_kjCondition_5);
    uVar2 = _kjCondition_5._0_8_;
    if (_kjCondition_5._0_8_ != 0) {
      pcVar10 = _kjCondition_5.op.content.ptr;
      _kjCondition_5._0_16_ = ZEXT816(0);
      (*(code *)**(undefined8 **)_kjCondition_5.op.content.size_)
                (_kjCondition_5.op.content.size_,uVar2,1,pcVar10,pcVar10,0);
    }
  }
  sVar6 = _kjCondition.op.content.size_;
  pcVar10 = _kjCondition.op.content.ptr;
  if (_kjCondition.op.content.ptr != (char *)0x0) {
    _kjCondition.op.content.ptr = (char *)0x0;
    _kjCondition.op.content.size_ = 0;
    (*(code *)**(undefined8 **)CONCAT71(_kjCondition._25_7_,_kjCondition.result))
              ((undefined8 *)CONCAT71(_kjCondition._25_7_,_kjCondition.result),pcVar10,1,sVar6,sVar6
               ,0);
  }
  local_1d0.segment = (SegmentBuilder *)0x29fd3f;
  _kjCondition_5.op.content.ptr = pcVar4;
  _kjCondition_5.op.content.size_ = sVar9 + 0x78;
  _kjCondition_5._0_8_ = uVar1;
  PointerReader::getList
            ((ListReader *)&_kjCondition_3,(PointerReader *)&_kjCondition_5,POINTER,(word *)0x0);
  _kjCondition_5.op.content.size_ =
       ((ulong)_kjCondition_3._24_8_ >> 0x23) + (local_388 >> 3) + _kjCondition_3.op.content.size_;
  _kjCondition_5.left = _kjCondition_3.left;
  _kjCondition_5.right = _kjCondition_3.right;
  _kjCondition_5.op.content.ptr = _kjCondition_3.op.content.ptr;
  _kjCondition_16._0_16_ =
       PointerReader::getBlob<capnp::Text>((PointerReader *)&_kjCondition_5,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[6]>::operator==
            ((DebugComparison<const_char_(&)[6],_capnp::Text::Reader> *)&_kjCondition,
             (DebugExpression<char_const(&)[6]> *)&local_1d0,(Reader *)&_kjCondition_16);
  if ((local_2b0._0_1_ == false) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_5.op.content.ptr = pcVar4;
    _kjCondition_5.op.content.size_ = sVar9 + 0x78;
    _kjCondition_5._0_8_ = uVar1;
    PointerReader::getList
              ((ListReader *)&_kjCondition_3,(PointerReader *)&_kjCondition_5,POINTER,(word *)0x0);
    _kjCondition_5.op.content.size_ =
         ((ulong)_kjCondition_3._24_8_ >> 0x23) + (local_388 >> 3) + _kjCondition_3.op.content.size_
    ;
    _kjCondition_5.left = _kjCondition_3.left;
    _kjCondition_5.right = _kjCondition_3.right;
    _kjCondition_5.op.content.ptr = _kjCondition_3.op.content.ptr;
    _kjCondition_16._0_16_ =
         PointerReader::getBlob<capnp::Text>((PointerReader *)&_kjCondition_5,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[64],kj::_::DebugComparison<char_const(&)[6],capnp::Text::Reader>&,char_const(&)[6],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xaa,ERROR,
               "\"failed: expected \" \"(\\\"xyzzy\\\") == (ptrs[15].getAs<List<Text>>()[1])\", _kjCondition, \"xyzzy\", ptrs[15].getAs<List<Text>>()[1]"
               ,(char (*) [64])"failed: expected (\"xyzzy\") == (ptrs[15].getAs<List<Text>>()[1])",
               (DebugComparison<const_char_(&)[6],_capnp::Text::Reader> *)&_kjCondition,
               (char (*) [6])"xyzzy",(Reader *)&_kjCondition_16);
  }
  uVar1 = local_1b0._0_8_;
  sVar9 = local_1b8;
  _kjCondition_16._0_8_ = anon_var_dwarf_a812;
  _kjCondition_3.left = local_1b0._0_4_;
  _kjCondition_3.right = local_1b0._4_4_;
  _kjCondition_3.op.content.ptr = pcVar5;
  _kjCondition_3.op.content.size_ = local_1b8;
  PointerBuilder::getBlob<capnp::Text>
            ((Builder *)&_kjCondition_5,(PointerBuilder *)&_kjCondition_3,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&_kjCondition,
             (DebugExpression<char_const(&)[4]> *)&_kjCondition_16,(Builder *)&_kjCondition_5);
  uVar2 = local_1b0._0_8_;
  if ((local_2a8 == false) && (kj::_::Debug::minSeverity < 3)) {
    local_1b0._0_4_ = (undefined4)uVar1;
    local_1b0._4_4_ = SUB84(uVar1,4);
    _kjCondition_3.left = local_1b0._0_4_;
    _kjCondition_3.right = local_1b0._4_4_;
    _kjCondition_3.op.content.ptr = pcVar5;
    _kjCondition_3.op.content.size_ = sVar9;
    local_1b0._0_8_ = uVar2;
    PointerBuilder::getBlob<capnp::Text>
              ((Builder *)&_kjCondition_5,(PointerBuilder *)&_kjCondition_3,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[52],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xaf,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (ptrs[0].getAs<Text>())\", _kjCondition, \"foo\", ptrs[0].getAs<Text>()"
               ,(char (*) [52])"failed: expected (\"foo\") == (ptrs[0].getAs<Text>())",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&_kjCondition,
               (char (*) [4])"foo",(Builder *)&_kjCondition_5);
    sVar9 = local_1b8;
  }
  uVar2 = local_1b0._0_8_;
  _kjCondition_16._0_8_ = "bar";
  local_1b0._0_4_ = (undefined4)uVar1;
  local_1b0._4_4_ = SUB84(uVar1,4);
  _kjCondition_3.left = local_1b0._0_4_;
  _kjCondition_3.right = local_1b0._4_4_;
  _kjCondition_3.op.content.ptr = pcVar5;
  _kjCondition_3.op.content.size_ = sVar9 + 8;
  local_1b0._0_8_ = uVar2;
  BVar12 = PointerBuilder::getBlob<capnp::Data>((PointerBuilder *)&_kjCondition_3,(void *)0x0,0);
  kj::heapString((String *)&_kjCondition_5,(char *)BVar12.super_ArrayPtr<unsigned_char>.ptr,
                 BVar12.super_ArrayPtr<unsigned_char>.size_);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_kj::String> *)&_kjCondition,
             (DebugExpression<char_const(&)[4]> *)&_kjCondition_16,(String *)&_kjCondition_5);
  pcVar4 = _kjCondition_5.op.content.ptr;
  uVar2 = _kjCondition_5._0_8_;
  if (_kjCondition_5._0_8_ != 0) {
    _kjCondition_5.left = 0;
    _kjCondition_5.right = 0;
    _kjCondition_5.op.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)_kjCondition_5.op.content.size_)
              (_kjCondition_5.op.content.size_,uVar2,1,pcVar4,pcVar4,0);
  }
  uVar2 = local_1b0._0_8_;
  if ((local_2a8 == false) && (kj::_::Debug::minSeverity < 3)) {
    local_1b0._0_4_ = (undefined4)uVar1;
    local_1b0._4_4_ = SUB84(uVar1,4);
    _kjCondition_3.left = local_1b0._0_4_;
    _kjCondition_3.right = local_1b0._4_4_;
    _kjCondition_3.op.content.ptr = pcVar5;
    _kjCondition_3.op.content.size_ = sVar9 + 8;
    local_1b0._0_8_ = uVar2;
    BVar12 = PointerBuilder::getBlob<capnp::Data>((PointerBuilder *)&_kjCondition_3,(void *)0x0,0);
    kj::heapString((String *)&_kjCondition_5,(char *)BVar12.super_ArrayPtr<unsigned_char>.ptr,
                   BVar12.super_ArrayPtr<unsigned_char>.size_);
    kj::_::Debug::
    log<char_const(&)[78],kj::_::DebugComparison<char_const(&)[4],kj::String>&,char_const(&)[4],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xb0,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (kj::heapString(ptrs[1].getAs<Data>().asChars()))\", _kjCondition, \"bar\", kj::heapString(ptrs[1].getAs<Data>().asChars())"
               ,(char (*) [78])
                "failed: expected (\"bar\") == (kj::heapString(ptrs[1].getAs<Data>().asChars()))",
               (DebugComparison<const_char_(&)[4],_kj::String> *)&_kjCondition,
               (char (*) [4])0x299857,(String *)&_kjCondition_5);
    pcVar4 = _kjCondition_5.op.content.ptr;
    uVar2 = _kjCondition_5._0_8_;
    if (_kjCondition_5._0_8_ != 0) {
      _kjCondition_5.left = 0;
      _kjCondition_5.right = 0;
      _kjCondition_5.op.content.ptr = (char *)0x0;
      (*(code *)**(undefined8 **)_kjCondition_5.op.content.size_)
                (_kjCondition_5.op.content.size_,uVar2,1,pcVar4,pcVar4,0);
    }
  }
  sVar9 = _kjCondition.op.content.size_;
  pcVar4 = _kjCondition.op.content.ptr;
  if (_kjCondition.op.content.ptr != (char *)0x0) {
    _kjCondition.op.content.ptr = (char *)0x0;
    _kjCondition.op.content.size_ = 0;
    (*(code *)**(undefined8 **)CONCAT71(_kjCondition._25_7_,_kjCondition.result))
              ((undefined8 *)CONCAT71(_kjCondition._25_7_,_kjCondition.result),pcVar4,1,sVar9,sVar9,
               0);
  }
  uVar2 = local_1b0._0_8_;
  local_1d0.segment = (SegmentBuilder *)0x29fd3f;
  sVar9 = local_1b8 + 0x78;
  local_1b0._0_4_ = (undefined4)uVar1;
  local_1b0._4_4_ = SUB84(uVar1,4);
  _kjCondition_5.left = local_1b0._0_4_;
  _kjCondition_5.right = local_1b0._4_4_;
  _kjCondition_5.op.content.ptr = pcVar5;
  _kjCondition_5.op.content.size_ = sVar9;
  local_1b0._0_8_ = uVar2;
  PointerBuilder::getList
            ((ListBuilder *)&_kjCondition_3,(PointerBuilder *)&_kjCondition_5,POINTER,(word *)0x0);
  _kjCondition_5.op.content.size_ =
       ((ulong)_kjCondition_3._24_8_ >> 0x23) + _kjCondition_3.op.content.size_;
  _kjCondition_5.left = _kjCondition_3.left;
  _kjCondition_5.right = _kjCondition_3.right;
  _kjCondition_5.op.content.ptr = _kjCondition_3.op.content.ptr;
  PointerBuilder::getBlob<capnp::Text>
            ((Builder *)&_kjCondition_16,(PointerBuilder *)&_kjCondition_5,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[6]>::operator==
            ((DebugComparison<const_char_(&)[6],_capnp::Text::Builder> *)&_kjCondition,
             (DebugExpression<char_const(&)[6]> *)&local_1d0,(Builder *)&_kjCondition_16);
  uVar2 = local_1b0._0_8_;
  if ((local_2a8 == false) && (kj::_::Debug::minSeverity < 3)) {
    local_1b0._0_4_ = (undefined4)uVar1;
    local_1b0._4_4_ = SUB84(uVar1,4);
    _kjCondition_5.left = local_1b0._0_4_;
    _kjCondition_5.right = local_1b0._4_4_;
    _kjCondition_5.op.content.ptr = pcVar5;
    _kjCondition_5.op.content.size_ = sVar9;
    local_1b0._0_8_ = uVar2;
    PointerBuilder::getList
              ((ListBuilder *)&_kjCondition_3,(PointerBuilder *)&_kjCondition_5,POINTER,(word *)0x0)
    ;
    _kjCondition_5.op.content.size_ =
         ((ulong)_kjCondition_3._24_8_ >> 0x23) + _kjCondition_3.op.content.size_;
    _kjCondition_5.left = _kjCondition_3.left;
    _kjCondition_5.right = _kjCondition_3.right;
    _kjCondition_5.op.content.ptr = _kjCondition_3.op.content.ptr;
    PointerBuilder::getBlob<capnp::Text>
              ((Builder *)&_kjCondition_16,(PointerBuilder *)&_kjCondition_5,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[64],kj::_::DebugComparison<char_const(&)[6],capnp::Text::Builder>&,char_const(&)[6],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xb1,ERROR,
               "\"failed: expected \" \"(\\\"xyzzy\\\") == (ptrs[15].getAs<List<Text>>()[1])\", _kjCondition, \"xyzzy\", ptrs[15].getAs<List<Text>>()[1]"
               ,(char (*) [64])"failed: expected (\"xyzzy\") == (ptrs[15].getAs<List<Text>>()[1])",
               (DebugComparison<const_char_(&)[6],_capnp::Text::Builder> *)&_kjCondition,
               (char (*) [6])"xyzzy",(Builder *)&_kjCondition_16);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Any, AnyStruct) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<test::TestAnyPointer>();

  initTestMessage(root.getAnyPointerField().initAs<TestAllTypes>());
  checkTestMessage(root.getAnyPointerField().getAs<TestAllTypes>());
  checkTestMessage(root.asReader().getAnyPointerField().getAs<TestAllTypes>());

  auto allTypes = root.getAnyPointerField().getAs<AnyStruct>().as<TestAllTypes>();
  auto allTypesReader = root.getAnyPointerField().getAs<AnyStruct>().asReader().as<TestAllTypes>();
  allTypes.setInt32Field(100);
  EXPECT_EQ(100, allTypes.getInt32Field());
  EXPECT_EQ(100, allTypesReader.getInt32Field());

  EXPECT_EQ(48, root.getAnyPointerField().getAs<AnyStruct>().getDataSection().size());
  EXPECT_EQ(20, root.getAnyPointerField().getAs<AnyStruct>().getPointerSection().size());

  EXPECT_EQ(48, root.getAnyPointerField().asReader().getAs<AnyStruct>().getDataSection().size());
  EXPECT_EQ(20, root.getAnyPointerField().asReader().getAs<AnyStruct>().getPointerSection().size());

  auto b = toAny(root.getAnyPointerField().getAs<TestAllTypes>());
  EXPECT_EQ(48, b.getDataSection().size());
  EXPECT_EQ(20, b.getPointerSection().size());

#if !_MSC_VER || defined(__clang__) // TODO(msvc): ICE on the necessary constructor; see any.h.
  b = root.getAnyPointerField().getAs<TestAllTypes>();
  EXPECT_EQ(48, b.getDataSection().size());
  EXPECT_EQ(20, b.getPointerSection().size());
#endif

  auto r = toAny(root.getAnyPointerField().getAs<TestAllTypes>().asReader());
  EXPECT_EQ(48, r.getDataSection().size());
  EXPECT_EQ(20, r.getPointerSection().size());

  r = toAny(root.getAnyPointerField().getAs<TestAllTypes>()).asReader();
  EXPECT_EQ(48, r.getDataSection().size());
  EXPECT_EQ(20, r.getPointerSection().size());

#if !_MSC_VER || defined(__clang__)  // TODO(msvc): ICE on the necessary constructor; see any.h.
  r = root.getAnyPointerField().getAs<TestAllTypes>().asReader();
  EXPECT_EQ(48, r.getDataSection().size());
  EXPECT_EQ(20, r.getPointerSection().size());
#endif

  {
    MallocMessageBuilder b2;
    auto root2 = b2.getRoot<test::TestAnyPointer>();
    auto sb = root2.getAnyPointerField().initAsAnyStruct(
        r.getDataSection().size() / 8, r.getPointerSection().size());

    EXPECT_EQ(48, sb.getDataSection().size());
    EXPECT_EQ(20, sb.getPointerSection().size());

    // TODO: is there a higher-level API for this?
    memcpy(sb.getDataSection().begin(), r.getDataSection().begin(), r.getDataSection().size());
  }

  {
    auto ptrs = r.getPointerSection();
    EXPECT_EQ("foo", ptrs[0].getAs<Text>());
    EXPECT_EQ("bar", kj::heapString(ptrs[1].getAs<Data>().asChars()));
    EXPECT_EQ("xyzzy", ptrs[15].getAs<List<Text>>()[1]);
  }

  {
    auto ptrs = b.getPointerSection();
    EXPECT_EQ("foo", ptrs[0].getAs<Text>());
    EXPECT_EQ("bar", kj::heapString(ptrs[1].getAs<Data>().asChars()));
    EXPECT_EQ("xyzzy", ptrs[15].getAs<List<Text>>()[1]);
  }
}